

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O2

bool __thiscall
Reducer::shrinkByReduction<wasm::DataSegment>(Reducer *this,DataSegment *segment,size_t bonus)

{
  pointer pcVar1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  ulong uVar5;
  ostream *poVar6;
  ulong uVar7;
  bool bVar8;
  undefined1 local_68 [8];
  vector<char,_std::allocator<char>_> save;
  ulong local_38;
  
  uVar7 = 0;
  local_38 = 1;
  bVar4 = false;
  save.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)bonus;
  do {
    pcVar1 = (segment->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pcVar2 = (segment->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    bVar8 = (ulong)((long)pcVar1 - (long)pcVar2) <= uVar7;
    bVar3 = bVar8 || pcVar1 == pcVar2;
    if (bVar8 || pcVar1 == pcVar2) {
      return bVar3;
    }
    if ((bVar4) ||
       (bVar4 = shouldTryToReduce(this,(size_t)save.super__Vector_base<char,_std::allocator<char>_>.
                                               _M_impl.super__Vector_impl_data._M_end_of_storage),
       bVar4)) {
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)local_68,&segment->data);
      uVar5 = local_38;
      while ((bVar4 = uVar5 != 0, uVar5 = uVar5 - 1, bVar4 &&
             (pcVar1 = (segment->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish,
             (segment->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start != pcVar1))) {
        (segment->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish = pcVar1 + -1;
      }
      bVar8 = writeAndTestReduction(this);
      if (bVar8) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"|      shrank segment from ");
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        poVar6 = std::operator<<(poVar6," => ");
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        poVar6 = std::operator<<(poVar6," (skip: ");
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        std::operator<<(poVar6,")\n");
        noteReduction(this,1);
        local_38 = local_38 * 2;
        if ((ulong)(long)this->factor <= local_38) {
          local_38 = (long)this->factor;
        }
      }
      else {
        std::vector<char,_std::allocator<char>_>::_M_move_assign(&segment->data,local_68);
      }
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                ((_Vector_base<char,_std::allocator<char>_> *)local_68);
      bVar4 = true;
      if (!bVar8) {
        return bVar3;
      }
    }
    else {
      bVar4 = false;
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

bool shrinkByReduction(T* segment, size_t bonus) {
    // try to reduce to first function. first, shrink segment elements.
    // while we are shrinking successfully, keep going exponentially.
    bool justShrank = false;

    auto& data = segment->data;
    // when we succeed, try to shrink by more and more, similar to bisection
    size_t skip = 1;
    for (size_t i = 0; i < data.size() && !data.empty(); i++) {
      if (justShrank || shouldTryToReduce(bonus)) {
        auto save = data;
        for (size_t j = 0; j < skip; j++) {
          if (data.empty()) {
            break;
          } else {
            data.pop_back();
          }
        }
        justShrank = writeAndTestReduction();
        if (justShrank) {
          std::cerr << "|      shrank segment from " << save.size() << " => "
                    << data.size() << " (skip: " << skip << ")\n";
          noteReduction();
          skip = std::min(size_t(factor), 2 * skip);
        } else {
          data = std::move(save);
          return false;
        }
      }
    }

    return true;
  }